

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSetImplement.h
# Opt level: O1

void * __thiscall
BitSetImplement<std::bitset<128UL>,_KDefectiveBase>::neighborSetOf
          (BitSetImplement<std::bitset<128UL>,_KDefectiveBase> *this,int idx)

{
  int iVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  pointer piVar3;
  undefined8 *puVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  puVar4 = (undefined8 *)operator_new(0x10);
  *puVar4 = 0;
  puVar4[1] = 0;
  pvVar2 = (this->super_KDefectiveBase).from;
  piVar3 = pvVar2[idx].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  lVar6 = (long)pvVar2[idx].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar3;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 2;
    lVar7 = 0;
    do {
      iVar1 = piVar3[lVar7];
      uVar5 = (ulong)iVar1;
      if (0x7f < uVar5) {
        std::__throw_out_of_range_fmt
                  ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar5,0x80);
      }
      puVar4[uVar5 >> 6] = puVar4[uVar5 >> 6] | 1L << ((byte)iVar1 & 0x3f);
      lVar7 = lVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  return puVar4;
}

Assistant:

void* BitSetImplement<Bitset, Base>::neighborSetOf(int idx) {
	Bitset *__Nei__ = new Bitset();
	for (int i = 0; i < from[idx].size(); i++) {
		int to = from[idx][i];
		__Nei__ -> set(to);
	}
	return __Nei__;
}